

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O2

void __thiscall absl::strings_internal::BigUnsigned<4>::MultiplyBy(BigUnsigned<4> *this,uint32_t v)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = this->size_;
  if (v != 1 && (long)(int)uVar1 != 0) {
    if (v == 0) {
      std::__fill_n_a<unsigned_int*,int,unsigned_int>(this->words_,this->size_);
      this->size_ = 0;
      return;
    }
    uVar2 = 0;
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    uVar4 = 0;
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      uVar4 = (ulong)this->words_[uVar2] * (ulong)v + uVar4;
      this->words_[uVar2] = (uint32_t)uVar4;
      uVar4 = uVar4 >> 0x20;
    }
    if (((int)uVar1 < 4) && (uVar4 != 0)) {
      this->words_[(int)uVar1] = (uint32_t)uVar4;
      this->size_ = this->size_ + 1;
    }
  }
  return;
}

Assistant:

void MultiplyBy(uint32_t v) {
    if (size_ == 0 || v == 1) {
      return;
    }
    if (v == 0) {
      SetToZero();
      return;
    }
    const uint64_t factor = v;
    uint64_t window = 0;
    for (int i = 0; i < size_; ++i) {
      window += factor * words_[i];
      words_[i] = window & 0xffffffff;
      window >>= 32;
    }
    // If carry bits remain and there's space for them, grow size_.
    if (window && size_ < max_words) {
      words_[size_] = window & 0xffffffff;
      ++size_;
    }
  }